

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O2

mraa_boolean_t is_arduino_board(void)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  uint *puVar3;
  size_t sVar4;
  char *__fmt;
  long lVar5;
  char gpiochip_label_arduino [10];
  char gpiochip_path [64];
  char gpiochip_label [64];
  char format_str [64];
  
  builtin_strncpy(gpiochip_label_arduino,"pcal9555a",10);
  snprintf(format_str,0x40,"%%%ds",0x3f);
  tristate = mraa_gpio_init_raw(0xd6);
  if (tristate == (mraa_gpio_context)0x0) {
    syslog(6,"edison: tristate not detected");
  }
  else {
    lVar5 = 0;
    do {
      if (lVar5 == 0x10) {
        syslog(5,"edison: Arduino board detected");
        return 1;
      }
      gpiochip_path[0x30] = '\0';
      gpiochip_path[0x31] = '\0';
      gpiochip_path[0x32] = '\0';
      gpiochip_path[0x33] = '\0';
      gpiochip_path[0x34] = '\0';
      gpiochip_path[0x35] = '\0';
      gpiochip_path[0x36] = '\0';
      gpiochip_path[0x37] = '\0';
      gpiochip_path[0x38] = '\0';
      gpiochip_path[0x39] = '\0';
      gpiochip_path[0x3a] = '\0';
      gpiochip_path[0x3b] = '\0';
      gpiochip_path[0x3c] = '\0';
      gpiochip_path[0x3d] = '\0';
      gpiochip_path[0x3e] = '\0';
      gpiochip_path[0x3f] = '\0';
      gpiochip_path[0x20] = '\0';
      gpiochip_path[0x21] = '\0';
      gpiochip_path[0x22] = '\0';
      gpiochip_path[0x23] = '\0';
      gpiochip_path[0x24] = '\0';
      gpiochip_path[0x25] = '\0';
      gpiochip_path[0x26] = '\0';
      gpiochip_path[0x27] = '\0';
      gpiochip_path[0x28] = '\0';
      gpiochip_path[0x29] = '\0';
      gpiochip_path[0x2a] = '\0';
      gpiochip_path[0x2b] = '\0';
      gpiochip_path[0x2c] = '\0';
      gpiochip_path[0x2d] = '\0';
      gpiochip_path[0x2e] = '\0';
      gpiochip_path[0x2f] = '\0';
      gpiochip_path[0x10] = '\0';
      gpiochip_path[0x11] = '\0';
      gpiochip_path[0x12] = '\0';
      gpiochip_path[0x13] = '\0';
      gpiochip_path[0x14] = '\0';
      gpiochip_path[0x15] = '\0';
      gpiochip_path[0x16] = '\0';
      gpiochip_path[0x17] = '\0';
      gpiochip_path[0x18] = '\0';
      gpiochip_path[0x19] = '\0';
      gpiochip_path[0x1a] = '\0';
      gpiochip_path[0x1b] = '\0';
      gpiochip_path[0x1c] = '\0';
      gpiochip_path[0x1d] = '\0';
      gpiochip_path[0x1e] = '\0';
      gpiochip_path[0x1f] = '\0';
      gpiochip_path[0] = '\0';
      gpiochip_path[1] = '\0';
      gpiochip_path[2] = '\0';
      gpiochip_path[3] = '\0';
      gpiochip_path[4] = '\0';
      gpiochip_path[5] = '\0';
      gpiochip_path[6] = '\0';
      gpiochip_path[7] = '\0';
      gpiochip_path[8] = '\0';
      gpiochip_path[9] = '\0';
      gpiochip_path[10] = '\0';
      gpiochip_path[0xb] = '\0';
      gpiochip_path[0xc] = '\0';
      gpiochip_path[0xd] = '\0';
      gpiochip_path[0xe] = '\0';
      gpiochip_path[0xf] = '\0';
      snprintf(gpiochip_path,0x40,"/sys/class/gpio/gpiochip%d/label",
               (ulong)*(uint *)((long)&DAT_00125c70 + lVar5));
      __stream = fopen(gpiochip_path,"r");
      if (__stream == (FILE *)0x0) {
        puVar3 = (uint *)__errno_location();
        uVar1 = *puVar3;
        __fmt = "edison: could not open \'%s\', errno %d";
LAB_00117aec:
        syslog(6,__fmt,gpiochip_path,(ulong)uVar1);
        return 0;
      }
      gpiochip_label[0x30] = '\0';
      gpiochip_label[0x31] = '\0';
      gpiochip_label[0x32] = '\0';
      gpiochip_label[0x33] = '\0';
      gpiochip_label[0x34] = '\0';
      gpiochip_label[0x35] = '\0';
      gpiochip_label[0x36] = '\0';
      gpiochip_label[0x37] = '\0';
      gpiochip_label[0x38] = '\0';
      gpiochip_label[0x39] = '\0';
      gpiochip_label[0x3a] = '\0';
      gpiochip_label[0x3b] = '\0';
      gpiochip_label[0x3c] = '\0';
      gpiochip_label[0x3d] = '\0';
      gpiochip_label[0x3e] = '\0';
      gpiochip_label[0x3f] = '\0';
      gpiochip_label[0x20] = '\0';
      gpiochip_label[0x21] = '\0';
      gpiochip_label[0x22] = '\0';
      gpiochip_label[0x23] = '\0';
      gpiochip_label[0x24] = '\0';
      gpiochip_label[0x25] = '\0';
      gpiochip_label[0x26] = '\0';
      gpiochip_label[0x27] = '\0';
      gpiochip_label[0x28] = '\0';
      gpiochip_label[0x29] = '\0';
      gpiochip_label[0x2a] = '\0';
      gpiochip_label[0x2b] = '\0';
      gpiochip_label[0x2c] = '\0';
      gpiochip_label[0x2d] = '\0';
      gpiochip_label[0x2e] = '\0';
      gpiochip_label[0x2f] = '\0';
      gpiochip_label[0x10] = '\0';
      gpiochip_label[0x11] = '\0';
      gpiochip_label[0x12] = '\0';
      gpiochip_label[0x13] = '\0';
      gpiochip_label[0x14] = '\0';
      gpiochip_label[0x15] = '\0';
      gpiochip_label[0x16] = '\0';
      gpiochip_label[0x17] = '\0';
      gpiochip_label[0x18] = '\0';
      gpiochip_label[0x19] = '\0';
      gpiochip_label[0x1a] = '\0';
      gpiochip_label[0x1b] = '\0';
      gpiochip_label[0x1c] = '\0';
      gpiochip_label[0x1d] = '\0';
      gpiochip_label[0x1e] = '\0';
      gpiochip_label[0x1f] = '\0';
      gpiochip_label[0] = '\0';
      gpiochip_label[1] = '\0';
      gpiochip_label[2] = '\0';
      gpiochip_label[3] = '\0';
      gpiochip_label[4] = '\0';
      gpiochip_label[5] = '\0';
      gpiochip_label[6] = '\0';
      gpiochip_label[7] = '\0';
      gpiochip_label[8] = '\0';
      gpiochip_label[9] = '\0';
      gpiochip_label[10] = '\0';
      gpiochip_label[0xb] = '\0';
      gpiochip_label[0xc] = '\0';
      gpiochip_label[0xd] = '\0';
      gpiochip_label[0xe] = '\0';
      gpiochip_label[0xf] = '\0';
      iVar2 = __isoc99_fscanf(__stream,format_str,gpiochip_label);
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      fclose(__stream);
      if (iVar2 != 1) {
        __fmt = "edison: could not read from \'%s\', errno %d";
        goto LAB_00117aec;
      }
      sVar4 = strlen(gpiochip_label);
      iVar2 = strncmp(gpiochip_label,gpiochip_label_arduino,sVar4 + 1);
      lVar5 = lVar5 + 4;
    } while (iVar2 == 0);
    syslog(6,"edison: gpiochip label (%s) is not what we expect (%s)\n",gpiochip_label,
           gpiochip_label_arduino);
  }
  return 0;
}

Assistant:

mraa_boolean_t
is_arduino_board()
{
    // We check for two things to determine if that's an Arduino expansion board
    // 1) is tristate GPIO available, by trying to initialize it
    // 2) are there four specific GPIO expanders, by reading device labels
    //        /sys/class/gpio/gpiochip{200,216,232,248}/label == "pcal9555a"
    char gpiochip_path[MAX_SIZE];
    char gpiochip_label[MAX_SIZE];
    const char gpiochip_label_arduino[] = "pcal9555a";
    const int gpiochip_idx[4] = { 200, 216, 232, 248 };

    // prepare format string for fscanf, based on MAX_SIZE
    char format_str[MAX_SIZE];
    snprintf(format_str, MAX_SIZE, "%%%ds", MAX_SIZE - 1);
    int i, ret, errno_saved;

    // check tristate first
    tristate = mraa_gpio_init_raw(214);
    if (tristate == NULL) {
        syslog(LOG_INFO, "edison: tristate not detected");
        return 0;
    }

    // GPIO expanders second
    for (i=0; i<(sizeof(gpiochip_idx)/sizeof(gpiochip_idx[0])); i++) {
        memset(gpiochip_path, 0, MAX_SIZE);
        snprintf(gpiochip_path,
                 MAX_SIZE,
                 SYSFS_CLASS_GPIO "/gpiochip%d/label",
                 gpiochip_idx[i]);
        FILE *fp;
        fp = fopen(gpiochip_path, "r");
        if (fp == NULL) {
            syslog(LOG_INFO,
                   "edison: could not open '%s', errno %d",
                   gpiochip_path,
                   errno);
            return 0;
        }

        memset(gpiochip_label, 0, MAX_SIZE);
        ret = fscanf(fp, format_str, &gpiochip_label);
        errno_saved = errno;
        fclose(fp);
        if (ret != 1) {
            syslog(LOG_INFO,
                   "edison: could not read from '%s', errno %d",
                   gpiochip_path,
                   errno_saved);
            return 0;
        }

        // we want to check for exact match
        if (strncmp(gpiochip_label, gpiochip_label_arduino, strlen(gpiochip_label) + 1) != 0) {
            syslog(LOG_INFO,
                   "edison: gpiochip label (%s) is not what we expect (%s)\n",
                   gpiochip_label,
                   gpiochip_label_arduino);
            return 0;
        }
    }

    syslog(LOG_NOTICE, "edison: Arduino board detected");
    return 1;
}